

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_erase_Test::test_matrix_sparse_erase_Test(test_matrix_sparse_erase_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0017ac38;
  return;
}

Assistant:

TEST(test_matrix_sparse, erase) {
  Matrix_Sparse matrix({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2);
  auto iter = matrix.erase(matrix.find(0, 1));
  EXPECT_EQ(matrix.size_row(), 2);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_TRUE(iter == matrix[0].end());  // should point to end
  EXPECT_DOUBLE_EQ(*iter, 3.0);          // end should be the next row over.
  EXPECT_DOUBLE_EQ(matrix[0][0], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 3.0);

  // Check debug undefined behaviour
  EXPECT_DEATH(matrix.erase(matrix.find(3, 0)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(0, 2)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(1, 1)), "./*");
}